

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.cc
# Opt level: O2

void re2c::UTF8addContinuous(RangeSuffix **root,rune l,rune h,uint32_t n)

{
  uint32_t lo;
  uint32_t hi;
  RangeSuffix *this;
  uint uVar1;
  uint32_t hcs [4];
  uint32_t lcs [4];
  
  utf8::rune_to_bytes(lcs,l);
  utf8::rune_to_bytes(hcs,h);
  uVar1 = 1;
  do {
    if (n < uVar1) {
      return;
    }
    lo = lcs[n - uVar1];
    hi = hcs[n - uVar1];
    while (this = *root, this != (RangeSuffix *)0x0) {
      if ((this->l == lo) && (this->h == hi)) goto LAB_0013a7f1;
      root = &this->next;
    }
    this = (RangeSuffix *)operator_new(0x18);
    RangeSuffix::RangeSuffix(this,lo,hi);
    *root = this;
LAB_0013a7f1:
    root = &this->child;
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

void UTF8addContinuous(RangeSuffix * & root, utf8::rune l, utf8::rune h, uint32_t n)
{
	uint32_t lcs[utf8::MAX_RUNE_LENGTH];
	uint32_t hcs[utf8::MAX_RUNE_LENGTH];
	utf8::rune_to_bytes(lcs, l);
	utf8::rune_to_bytes(hcs, h);

	RangeSuffix ** p = &root;
	for (uint32_t i = 1; i <= n; ++i)
	{
		const uint32_t lc = lcs[n - i];
		const uint32_t hc = hcs[n - i];
		for (;;)
		{
			if (*p == NULL)
			{
				*p = new RangeSuffix(lc, hc);
				p = &(*p)->child;
				break;
			}
			else if ((*p)->l == lc && (*p)->h == hc)
			{
				p = &(*p)->child;
				break;
			}
			else
				p = &(*p)->next;
		}
	}
}